

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O1

void QNetworkInformationPrivate::removeFromList(QNetworkInformationBackendFactory *factory)

{
  __pointer_type pQVar1;
  Type *pTVar2;
  Type *pTVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QNetworkInformationBackendFactory *local_28;
  anon_class_8_1_54a39814_for__M_pred local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((__atomic_base<signed_char>)
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>::guard._q_value.
      super___atomic_base<signed_char>._M_i != -1) goto LAB_001b616d;
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::instance
                     ();
  if ((pTVar2->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar4 = (pTVar2->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p ==
            (__pointer_type)0x0;
    if (bVar4) {
      (pTVar2->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar4) goto LAB_001b6136;
  }
  else {
LAB_001b6136:
    QBasicMutex::lockInternal();
  }
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::instance
                     ();
  local_28 = factory;
  local_20.t = (QNetworkAccessBackendFactory **)&local_28;
  QtPrivate::
  sequential_erase_if<QList<QNetworkInformationBackendFactory*>,QtPrivate::sequential_erase<QList<QNetworkInformationBackendFactory*>,QNetworkInformationBackendFactory*>(QList<QNetworkInformationBackendFactory*>&,QNetworkInformationBackendFactory*const&)::_lambda(auto:1_const&)_1_>
            (&pTVar3->factories,&local_20);
  LOCK();
  pQVar1 = (pTVar2->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (pTVar2->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pTVar2);
  }
LAB_001b616d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkInformationPrivate::removeFromList(QNetworkInformationBackendFactory *factory)
{
    // @note: factory is in the base class dtor
    if (!dataHolder.exists())
        return;
    QMutexLocker locker(&dataHolder->instanceMutex);
    dataHolder->factories.removeAll(factory);
}